

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectRestraint.cpp
# Opt level: O1

void __thiscall OpenMD::ObjectRestraint::calcForce(ObjectRestraint *this,Vector3d *struc)

{
  Vector3d *pVVar1;
  undefined8 uVar2;
  uint i;
  long lVar3;
  mapped_type *pmVar4;
  double tmp;
  double dVar5;
  double tmp_1;
  double dVar6;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result;
  Vector<double,_3U> result_3;
  Vector<double,_3U> result_1;
  double local_a8 [4];
  double local_88;
  undefined8 uStack_80;
  double local_78 [4];
  double local_58 [4];
  double local_38 [4];
  
  (this->super_Restraint).pot_ = 0.0;
  pVVar1 = &this->force_;
  if (pVVar1 != (Vector3d *)OpenMD::V3Zero) {
    (this->force_).super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
    uVar2 = OpenMD::V3Zero._8_8_;
    (pVVar1->super_Vector<double,_3U>).data_[0] = (double)OpenMD::V3Zero._0_8_;
    (this->force_).super_Vector<double,_3U>.data_[1] = (double)uVar2;
  }
  if (((this->super_Restraint).restType_ & 1) != 0) {
    local_78[0] = 0.0;
    local_78[1] = 0.0;
    local_78[2] = 0.0;
    lVar3 = 0;
    do {
      local_78[lVar3] =
           (struc->super_Vector<double,_3U>).data_[lVar3] -
           (this->refPos_).super_Vector<double,_3U>.data_[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    dVar5 = 0.0;
    lVar3 = 0;
    do {
      dVar5 = dVar5 + local_78[lVar3] * local_78[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar6 = (this->super_Restraint).kDisp_;
    local_38[0] = 0.0;
    local_38[1] = 0.0;
    local_38[2] = 0.0;
    lVar3 = 0;
    do {
      local_38[lVar3] = local_78[lVar3] * -dVar6;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    local_88 = 0.0;
    lVar3 = 0;
    do {
      local_88 = local_88 + local_78[lVar3] * local_78[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    local_88 = dVar6 * 0.5 * local_88;
    (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + local_88;
    dVar6 = (this->super_Restraint).scaleFactor_;
    local_a8[0] = 0.0;
    local_a8[1] = 0.0;
    local_a8[2] = 0.0;
    lVar3 = 0;
    do {
      local_a8[lVar3] = local_38[lVar3] * dVar6;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar3 = 0;
    do {
      (pVVar1->super_Vector<double,_3U>).data_[lVar3] =
           local_a8[lVar3] + (pVVar1->super_Vector<double,_3U>).data_[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    if ((this->super_Restraint).printRest_ == true) {
      local_a8[0] = (double)CONCAT44(local_a8[0]._4_4_,1);
      uStack_80 = 0;
      pmVar4 = std::
               map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
               ::operator[](&(this->super_Restraint).restInfo_,(key_type *)local_a8);
      pmVar4->first = dVar5;
      pmVar4->second = local_88;
    }
  }
  if (((this->super_Restraint).restType_ & 2) != 0) {
    dVar6 = (struc->super_Vector<double,_3U>).data_[2] - (this->super_Restraint).posZ0_;
    dVar5 = (this->super_Restraint).kAbs_;
    local_a8[0] = 0.0;
    local_a8[1] = 0.0;
    local_a8[2] = -dVar5 * dVar6;
    local_88 = dVar5 * 0.5 * dVar6 * dVar6;
    (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + local_88;
    dVar5 = (this->super_Restraint).scaleFactor_;
    local_58[0] = 0.0;
    local_58[1] = 0.0;
    local_58[2] = 0.0;
    lVar3 = 0;
    do {
      local_58[lVar3] = local_a8[lVar3] * dVar5;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar3 = 0;
    do {
      (pVVar1->super_Vector<double,_3U>).data_[lVar3] =
           local_58[lVar3] + (pVVar1->super_Vector<double,_3U>).data_[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    if ((this->super_Restraint).printRest_ == true) {
      local_58[0] = (double)CONCAT44(local_58[0]._4_4_,2);
      uStack_80 = 0;
      pmVar4 = std::
               map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
               ::operator[](&(this->super_Restraint).restInfo_,(key_type *)local_58);
      pmVar4->first = dVar6;
      pmVar4->second = local_88;
    }
  }
  return;
}

Assistant:

void ObjectRestraint::calcForce(Vector3d struc) {
    pot_   = 0.0;
    force_ = V3Zero;

    if (restType_ & rtDisplacement) {
      Vector3d del = struc - refPos_;
      RealType r   = del.length();
      Vector3d frc = -kDisp_ * del;
      RealType p   = 0.5 * kDisp_ * del.lengthSquare();

      pot_ += p;
      force_ += frc * scaleFactor_;
      if (printRest_) restInfo_[rtDisplacement] = std::make_pair(r, p);
    }

    if (restType_ & rtAbsoluteZ) {
      RealType r   = struc(2) - posZ0_;
      Vector3d frc = Vector3d(0.0, 0.0, -kAbs_ * r);
      RealType p   = 0.5 * kAbs_ * r * r;

      pot_ += p;
      force_ += frc * scaleFactor_;
      if (printRest_) restInfo_[rtAbsoluteZ] = std::make_pair(r, p);
    }
  }